

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

void __thiscall
BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
          (BayesianGameIdenticalPayoff *this,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes,bool useSparseRewardModel)

{
  void *pvVar1;
  RewardModelMapping *in_RDI;
  byte in_R8B;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  BayesianGameIdenticalPayoffInterface *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffef0;
  string *s_str;
  string *in_stack_ffffffffffffff00;
  allocator<char> *__a;
  string *in_stack_ffffffffffffff08;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  RewardModelMappingSparseMapped *this_00;
  size_t in_stack_ffffffffffffff18;
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [38];
  undefined1 local_82;
  undefined1 local_81 [40];
  undefined1 local_59 [56];
  _Alloc_hider local_21;
  
  local_21 = (_Alloc_hider)(in_R8B & 1);
  BayesianGameIdenticalPayoffInterface::BayesianGameIdenticalPayoffInterface
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  (in_RDI->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
  _vptr_QTableInterface = (_func_int **)&PTR__BayesianGameIdenticalPayoff_00d06650;
  in_RDI[1]._m_R.size2_ = 0;
  *(undefined1 *)&in_RDI[1]._m_R.size1_ = 0;
  if (((byte)local_21 & 1) == 0) {
    pvVar1 = operator_new(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (allocator<char> *)in_stack_ffffffffffffff00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (allocator<char> *)in_stack_ffffffffffffff00);
    RewardModelMapping::RewardModelMapping
              (in_RDI,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    in_RDI[1]._m_R.size2_ = (size_type)pvVar1;
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  else {
    pvVar1 = operator_new(0x98);
    local_82 = 1;
    __a = *(allocator<char> **)((long)&in_RDI[1]._m_s_str.field_2 + 8);
    __s = *(char **)&in_RDI[1]._m_ja_str;
    this_00 = (RewardModelMappingSparseMapped *)local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__s,__a)
    ;
    s_str = (string *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__s,__a)
    ;
    RewardModelMappingSparseMapped::RewardModelMappingSparseMapped
              (this_00,(size_t)__s,(size_t)__a,s_str,in_stack_fffffffffffffef0);
    local_82 = 0;
    in_RDI[1]._m_R.size2_ = (size_type)pvVar1;
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    std::__cxx11::string::~string((string *)(local_59 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_59);
  }
  return;
}

Assistant:

BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(size_t nrAgents, 
                                                         const vector<size_t>& nrActions, 
                                                         const vector<size_t>& nrTypes,
                                                         bool useSparseRewardModel) :
    BayesianGameIdenticalPayoffInterface(nrAgents, nrActions, nrTypes),
    _m_utilFunction(0)
{
    _m_initialized=false;

    if(useSparseRewardModel)
        _m_utilFunction=new RewardModelMappingSparseMapped(_m_nrJTypes, _m_nrJA, "type", "ja");
    else
        _m_utilFunction=new RewardModelMapping(_m_nrJTypes, _m_nrJA, "type", "ja");
}